

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.h
# Opt level: O0

void activate(layer_t *layer,tensor_t<float> *in)

{
  tensor_t<float> *in_00;
  fc_layer_t *in_RSI;
  uint *in_RDI;
  
  in_00 = (tensor_t<float> *)(ulong)*in_RDI;
  switch(in_00) {
  case (tensor_t<float> *)0x0:
    conv_layer_t::activate((conv_layer_t *)in_RSI,in_00);
    break;
  case (tensor_t<float> *)0x1:
    fc_layer_t::activate(in_RSI,in_00);
    break;
  case (tensor_t<float> *)0x2:
    relu_layer_t::activate((relu_layer_t *)in_RSI,in_00);
    break;
  case (tensor_t<float> *)0x3:
    pool_layer_t::activate((pool_layer_t *)in_RSI,in_00);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/cnn.h"
                  ,0x41,"void activate(layer_t *, tensor_t<float> &)");
  }
  return;
}

Assistant:

static void activate(layer_t *layer, tensor_t<float> &in) {
    switch (layer->type) {
        case layer_type::conv:
            ((conv_layer_t *) layer)->activate(in);
            return;
        case layer_type::relu:
            ((relu_layer_t *) layer)->activate(in);
            return;
        case layer_type::fc:
            ((fc_layer_t *) layer)->activate(in);
            return;
        case layer_type::pool:
            ((pool_layer_t *) layer)->activate(in);
            return;
        default:
            assert(false);
    }
}